

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::lazyPrintRunInfo(ConsoleReporter *this)

{
  TestRunInfo *pTVar1;
  char *pcVar2;
  int iVar3;
  size_t sVar4;
  ostream *poVar5;
  Colour colour;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  poVar5 = (this->super_StreamingReporterBase).stream;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  if (getLineOfChars<(char)126>()::line == '\0') {
    uRam00000000001c0710 = 0x7e7e7e7e7e7e7e;
    uRam00000000001c0717 = 0x7e7e7e7e7e7e7e7e;
    _DAT_001c0700 = 0x7e7e7e7e7e7e7e7e;
    uRam00000000001c0708 = 0x7e7e7e7e7e7e7e;
    DAT_001c070f = 0x7e;
    _DAT_001c06f0 = 0x7e7e7e7e7e7e7e7e;
    uRam00000000001c06f8 = 0x7e7e7e7e7e7e7e7e;
    _DAT_001c06e0 = 0x7e7e7e7e7e7e7e7e;
    uRam00000000001c06e8 = 0x7e7e7e7e7e7e7e7e;
    _line = 0x7e7e7e7e7e7e7e7e;
    uRam00000000001c06d8 = 0x7e7e7e7e7e7e7e7e;
    DAT_001c071f = 0;
  }
  sVar4 = strlen(&getLineOfChars<(char)126>()::line);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,&getLineOfChars<(char)126>()::line,sVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  Colour::use(FileName);
  pTVar1 = (this->super_StreamingReporterBase).currentTestRunInfo.super_Option<Catch::TestRunInfo>.
           nullableValue;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_StreamingReporterBase).stream,(pTVar1->name)._M_dataplus._M_p,
                      (pTVar1->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," is a Catch v",0xd);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,".",1);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," b",2);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"master","");
  iVar3 = std::__cxx11::string::compare((char *)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  if (iVar3 != 0) {
    poVar5 = (this->super_StreamingReporterBase).stream;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," (",2);
    pcVar2 = DAT_001c0620;
    if (DAT_001c0620 == (char *)0x0) {
      std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
    }
    else {
      sVar4 = strlen(DAT_001c0620);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar2,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
  }
  poVar5 = (this->super_StreamingReporterBase).stream;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," host application.\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Run with -? for options\n\n",0x19);
  iVar3 = (*(((this->super_StreamingReporterBase).m_config.m_p)->super_IShared).super_NonCopyable.
            _vptr_NonCopyable[0xf])();
  if (iVar3 != 0) {
    poVar5 = (this->super_StreamingReporterBase).stream;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Randomness seeded to: ",0x16);
    (*(((this->super_StreamingReporterBase).m_config.m_p)->super_IShared).super_NonCopyable.
      _vptr_NonCopyable[0xf])();
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n\n",2);
  }
  (this->super_StreamingReporterBase).currentTestRunInfo.used = true;
  Colour::use(None);
  return;
}

Assistant:

void lazyPrintRunInfo() {
            stream  << "\n" << getLineOfChars<'~'>() << "\n";
            Colour colour( Colour::SecondaryText );
            stream  << currentTestRunInfo->name
                    << " is a Catch v"  << libraryVersion.majorVersion << "."
                    << libraryVersion.minorVersion << " b"
                    << libraryVersion.buildNumber;
            if( libraryVersion.branchName != std::string( "master" ) )
                stream << " (" << libraryVersion.branchName << ")";
            stream  << " host application.\n"
                    << "Run with -? for options\n\n";

            if( m_config->rngSeed() != 0 )
                stream << "Randomness seeded to: " << m_config->rngSeed() << "\n\n";

            currentTestRunInfo.used = true;
        }